

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

BOOL __thiscall
Memory::Recycler::WaitForConcurrentThread(Recycler *this,DWORD waitTime,RecyclerWaitReason caller)

{
  CollectionState CVar1;
  code *pcVar2;
  bool bVar3;
  DWORD DVar4;
  undefined4 *puVar5;
  
  CVar1 = (this->collectionState).value;
  if (CVar1 != CollectionStateParallelMark && (CVar1 >> 0xd & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x167a,
                       "(this->IsConcurrentState() || this->collectionState == CollectionStateParallelMark)"
                       ,
                       "this->IsConcurrentState() || this->collectionState == CollectionStateParallelMark"
                      );
    if (!bVar3) goto LAB_007189be;
    *puVar5 = 0;
  }
  if (this->concurrentThread != (HANDLE)0x0) {
    SetThreadPriority(this->concurrentThread,0);
  }
  DVar4 = WaitForSingleObject(this->concurrentWorkDoneEvent,waitTime);
  if (this->concurrentThread == (HANDLE)0x0) goto LAB_007189ab;
  if (DVar4 == 0) {
LAB_00718992:
    SetThreadPriority(this->concurrentThread,-1);
    bVar3 = false;
  }
  else {
    bVar3 = true;
    if (DVar4 != 0x102) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x16bc,"(ret == 0)","ret == WAIT_OBJECT_0");
      if (!bVar3) {
LAB_007189be:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
      goto LAB_00718992;
    }
  }
  this->priorityBoost = bVar3;
LAB_007189ab:
  return (BOOL)(DVar4 == 0);
}

Assistant:

BOOL
Recycler::WaitForConcurrentThread(DWORD waitTime, RecyclerWaitReason caller)
{
    Assert(this->IsConcurrentState() || this->collectionState == CollectionStateParallelMark);

    RECYCLER_PROFILE_EXEC_BEGIN(this, Js::ConcurrentWaitPhase);

    if (concurrentThread != NULL)
    {
        // Set the priority back to normal before we wait to ensure it doesn't starve
        SetThreadPriority(this->concurrentThread, THREAD_PRIORITY_NORMAL);
    }

#ifdef ENABLE_BASIC_TELEMETRY
    bool isBlockingMainThread = false;
    Js::Tick start;
    FILETIME kernelTime1;
    FILETIME userTime1;
    HANDLE hProcess = GetCurrentProcess();
    if (this->telemetryStats.ShouldStartTelemetryCapture())
    {
        isBlockingMainThread = this->telemetryStats.IsOnScriptThread();
        if (isBlockingMainThread)
        {
            start = Js::Tick::Now();
            FILETIME creationTime;
            FILETIME exitTime;
            GetProcessTimes(hProcess, &creationTime, &exitTime, &kernelTime1, &userTime1);
        }
    }
#endif

    DWORD ret = WaitForSingleObject(concurrentWorkDoneEvent, waitTime);

#ifdef ENABLE_BASIC_TELEMETRY
    if (isBlockingMainThread)
    {
        Js::Tick end = Js::Tick::Now();
        Js::TickDelta elapsed = end - start;

        FILETIME creationTime;
        FILETIME exitTime;
        FILETIME kernelTime2;
        FILETIME userTime2;

        GetProcessTimes(hProcess, &creationTime, &exitTime, &kernelTime2, &userTime2);
        uint64 kernelTime = DiffFileTimes(&kernelTime2 , &kernelTime1);
        uint64 userTime = DiffFileTimes(&userTime2, &userTime1);

        // userTime & kernelTime reported from GetProcessTimes is the number of 100-nanosecond ticks
        // for consistency convert to microseconds.
        kernelTime = kernelTime / 10;
        userTime = userTime / 10;

        this->telemetryStats.IncrementUserThreadBlockedCount(elapsed.ToMicroseconds(), caller);
        this->telemetryStats.IncrementUserThreadBlockedCpuTimeUser(userTime, caller);
        this->telemetryStats.IncrementUserThreadBlockedCpuTimeKernel(kernelTime, caller);
    }
#endif

    if (concurrentThread != NULL)
    {
        if (ret == WAIT_TIMEOUT)
        {
            // Keep the priority boost.
            priorityBoost = true;
        }
        else
        {
            Assert(ret == WAIT_OBJECT_0);

            // Back to below normal
            SetThreadPriority(this->concurrentThread, THREAD_PRIORITY_BELOW_NORMAL);
            priorityBoost = false;
        }
    }

    RECYCLER_PROFILE_EXEC_END(this, Js::ConcurrentWaitPhase);

    return (ret == WAIT_OBJECT_0);
}